

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>::New
          (ScriptContext *scriptContext,SimplePropertyDescriptor *propertyDescriptors,
          int propertyCount,uint16 inlineSlotCapacity,uint16 offsetOfInlineSlots,bool isLocked,
          bool isShared)

{
  Recycler *pRVar1;
  SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *this;
  TrackAllocData local_58;
  byte local_2a;
  byte local_29;
  uint16 local_28;
  uint16 local_26;
  bool isShared_local;
  int iStack_24;
  bool isLocked_local;
  uint16 offsetOfInlineSlots_local;
  uint16 inlineSlotCapacity_local;
  int propertyCount_local;
  SimplePropertyDescriptor *propertyDescriptors_local;
  ScriptContext *scriptContext_local;
  
  local_2a = isShared;
  local_29 = isLocked;
  local_28 = offsetOfInlineSlots;
  local_26 = inlineSlotCapacity;
  iStack_24 = propertyCount;
  _offsetOfInlineSlots_local = propertyDescriptors;
  propertyDescriptors_local = (SimplePropertyDescriptor *)scriptContext;
  PropertyIndexRangesBase<Js::PropertyIndexRanges<int>_>::VerifySlotCapacity(propertyCount);
  pRVar1 = ScriptContext::GetRecycler((ScriptContext *)propertyDescriptors_local);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,
             (type_info *)
             &SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
             ,0xfa);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_58);
  this = (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *)
         new<Memory::Recycler>(0x30,pRVar1,0x43c4b0);
  SimpleDictionaryTypeHandlerBase
            (this,(ScriptContext *)propertyDescriptors_local,_offsetOfInlineSlots_local,iStack_24,
             iStack_24,local_26,local_28,(bool)(local_29 & 1),(bool)(local_2a & 1),false);
  return this;
}

Assistant:

SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported> * SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::New(ScriptContext * scriptContext, SimplePropertyDescriptor const* propertyDescriptors, int propertyCount, uint16 inlineSlotCapacity, uint16 offsetOfInlineSlots, bool isLocked, bool isShared)
    {
        PropertyIndexRangesType::VerifySlotCapacity(propertyCount);
        return RecyclerNew(scriptContext->GetRecycler(), SimpleDictionaryTypeHandlerBase, scriptContext, propertyDescriptors, propertyCount, propertyCount, inlineSlotCapacity, offsetOfInlineSlots, isLocked, isShared);
    }